

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cloud_cover.cpp
# Opt level: O3

ANNbool readPt(istream *in,int *p,int dim)

{
  ulong uVar1;
  ANNbool AVar2;
  long *plVar3;
  ulong uVar4;
  int *piVar5;
  
  if (dim < 1) {
    return ANNtrue;
  }
  plVar3 = (long *)std::istream::operator>>((istream *)in,p);
  AVar2 = ANNfalse;
  if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
    piVar5 = p + 1;
    uVar1 = 1;
    do {
      uVar4 = uVar1;
      if ((uint)dim == uVar4) break;
      plVar3 = (long *)std::istream::operator>>((istream *)in,piVar5);
      piVar5 = piVar5 + 1;
      uVar1 = uVar4 + 1;
    } while ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0);
    AVar2 = (ANNbool)((uint)dim <= uVar4);
  }
  return AVar2;
}

Assistant:

ANNbool readPt(istream &in, int *p, int dim)  
{
    for (int i = 0; i < dim; i++) {
        if (!(in >> p[i])) return ANNfalse;
    }
    return ANNtrue;
}